

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O0

TCGLabelPoolData *
new_pool_alloc(TCGContext_conflict9 *s,int nlong,int rtype,tcg_insn_unit *label,intptr_t addend)

{
  TCGLabelPoolData *pTVar1;
  TCGLabelPoolData *n;
  intptr_t addend_local;
  tcg_insn_unit *label_local;
  int rtype_local;
  int nlong_local;
  TCGContext_conflict9 *s_local;
  
  pTVar1 = (TCGLabelPoolData *)tcg_malloc(s,nlong * 8 + 0x20);
  pTVar1->label = label;
  pTVar1->addend = addend;
  pTVar1->rtype = rtype;
  pTVar1->nlong = nlong;
  return pTVar1;
}

Assistant:

static TCGLabelPoolData *new_pool_alloc(TCGContext *s, int nlong, int rtype,
                                        tcg_insn_unit *label, intptr_t addend)
{
    TCGLabelPoolData *n = tcg_malloc(s, sizeof(TCGLabelPoolData)
                                     + sizeof(tcg_target_ulong) * nlong);

    n->label = label;
    n->addend = addend;
    n->rtype = rtype;
    n->nlong = nlong;
    return n;
}